

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExprComponents * __thiscall
Catch::ExpressionResultBuilder::ExprComponents::operator=
          (ExprComponents *this,ExprComponents *param_1)

{
  ExprComponents *param_1_local;
  ExprComponents *this_local;
  
  this->shouldNegate = (bool)(param_1->shouldNegate & 1);
  std::__cxx11::string::operator=((string *)&this->lhs,(string *)&param_1->lhs);
  std::__cxx11::string::operator=((string *)&this->rhs,(string *)&param_1->rhs);
  std::__cxx11::string::operator=((string *)&this->op,(string *)&param_1->op);
  return this;
}

Assistant:

ExprComponents() : shouldNegate( false ) {}